

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack23_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7fffff;
  out[1] = uVar1 >> 0x17;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x17 | (uVar2 & 0x3fff) << 9;
  uVar1 = in[2];
  out[2] = uVar2 >> 0xe;
  out[2] = uVar2 >> 0xe | (uVar1 & 0x1f) << 0x12;
  uVar2 = in[3];
  out[3] = uVar1 >> 5 & 0x7fffff;
  out[4] = uVar1 >> 0x1c;
  out[4] = uVar1 >> 0x1c | (uVar2 & 0x7ffff) << 4;
  uVar1 = in[4];
  out[5] = uVar2 >> 0x13;
  out[5] = uVar2 >> 0x13 | (uVar1 & 0x3ff) << 0xd;
  out[6] = uVar1 >> 10;
  uVar2 = in[5];
  out[6] = uVar1 >> 10 | (uVar2 & 1) << 0x16;
  out[7] = uVar2 >> 1 & 0x7fffff;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack23_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 14)) << (23 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 5)) << (23 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 23);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 19)) << (23 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 10)) << (23 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 1)) << (23 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 23);
  out++;

  return in + 1;
}